

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this)

{
  ~IfcDistributionElementType(this);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}